

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68020_cprestore(m68k_info *info)

{
  cs_m68k *op;
  
  if ((info->type & 0x1c) != 0) {
    op = build_init_op(info,0xbd,1,0);
    get_ea_mode_op(info,op->operands,info->ir,1);
    return;
  }
  d68000_invalid(info);
  return;
}

Assistant:

static void d68020_cprestore(m68k_info *info)
{
	cs_m68k* ext;
	LIMIT_CPU_TYPES(info, M68020_PLUS);

	ext = build_init_op(info, M68K_INS_FRESTORE, 1, 0);
	get_ea_mode_op(info, &ext->operands[0], info->ir, 1);
}